

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_teebuf.hpp
# Opt level: O0

void __thiscall
OpenMD::basic_teebuf<char,std::char_traits<char>>::
basic_teebuf<__gnu_cxx::__normal_iterator<std::streambuf**,std::vector<std::streambuf*,std::allocator<std::streambuf*>>>>
          (basic_teebuf<char,_std::char_traits<char>_> *this,
          __normal_iterator<std::basic_streambuf<char,_std::char_traits<char>_>_**,_std::vector<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_streambuf<char,_std::char_traits<char>_>_*>_>_>
          begin,__normal_iterator<std::basic_streambuf<char,_std::char_traits<char>_>_**,_std::vector<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_streambuf<char,_std::char_traits<char>_>_*>_>_>
                end)

{
  allocator_type *in_RDX;
  vector<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_streambuf<char,_std::char_traits<char>_>_*>_>
  *in_RSI;
  streambuf *in_RDI;
  __normal_iterator<std::basic_streambuf<char,_std::char_traits<char>_>_**,_std::vector<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_streambuf<char,_std::char_traits<char>_>_*>_>_>
  __last;
  __normal_iterator<std::basic_streambuf<char,_std::char_traits<char>_>_**,_std::vector<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_streambuf<char,_std::char_traits<char>_>_*>_>_>
  __first;
  
  __last._M_current = (basic_streambuf<char,_std::char_traits<char>_> **)in_RDI;
  std::streambuf::streambuf(in_RDI);
  *(undefined ***)in_RDI = &PTR__basic_teebuf_00520170;
  __first._M_current = (basic_streambuf<char,_std::char_traits<char>_> **)in_RDX;
  std::allocator<std::basic_streambuf<char,_std::char_traits<char>_>_*>::allocator
            ((allocator<std::basic_streambuf<char,_std::char_traits<char>_>_*> *)0x19588b);
  std::vector<std::streambuf*,std::allocator<std::streambuf*>>::
  vector<__gnu_cxx::__normal_iterator<std::streambuf**,std::vector<std::streambuf*,std::allocator<std::streambuf*>>>,void>
            (in_RSI,__first,__last,in_RDX);
  std::allocator<std::basic_streambuf<char,_std::char_traits<char>_>_*>::~allocator
            ((allocator<std::basic_streambuf<char,_std::char_traits<char>_>_*> *)0x1958b0);
  return;
}

Assistant:

basic_teebuf(ForwardIterator begin, ForwardIterator end) :
        buffers_(begin, end) {}